

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

Schema __thiscall capnp::SchemaLoader::getUnbound(SchemaLoader *this,uint64_t id)

{
  Reader brand;
  Own<capnp::SchemaLoader::Impl> *this_00;
  Impl *this_01;
  RawBrandedSchema *raw;
  undefined1 local_70 [32];
  Impl *pIStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  RawBrandedSchema *local_28;
  Schema schema;
  uint64_t id_local;
  SchemaLoader *this_local;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_70._24_8_ = (Disposer *)0x0;
  pIStack_50 = (Impl *)0x0;
  schema.raw = (RawBrandedSchema *)id;
  capnp::schema::Brand::Reader::Reader((Reader *)(local_70 + 0x18));
  Schema::Schema((Schema *)(local_70 + 0x10));
  brand._reader.capTable = (CapTableReader *)pIStack_50;
  brand._reader.segment = (SegmentReader *)local_70._24_8_;
  brand._reader.data = (void *)local_48;
  brand._reader.pointers = (WirePointer *)uStack_40;
  brand._reader.dataSize = (undefined4)local_38;
  brand._reader.pointerCount = local_38._4_2_;
  brand._reader._38_2_ = local_38._6_2_;
  brand._reader._40_8_ = uStack_30;
  local_28 = (RawBrandedSchema *)get(this,id,brand,(Schema)local_70._16_8_);
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl>_> *)local_70);
  this_00 = kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::operator->
                      ((Locked<kj::Own<capnp::SchemaLoader::Impl>_> *)local_70);
  this_01 = kj::Own<capnp::SchemaLoader::Impl>::get(this_00);
  raw = Impl::getUnbound(this_01,local_28->generic);
  Schema::Schema((Schema *)&this_local,raw);
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::~Locked
            ((Locked<kj::Own<capnp::SchemaLoader::Impl>_> *)local_70);
  return (Schema)(RawBrandedSchema *)this_local;
}

Assistant:

Schema SchemaLoader::getUnbound(uint64_t id) const {
  auto schema = get(id);
  return Schema(impl.lockExclusive()->get()->getUnbound(schema.raw->generic));
}